

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall kj::anon_unknown_36::WebSocketPipeImpl::close(WebSocketPipeImpl *this,int __fd)

{
  Coroutine<void> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  kj *this_02;
  int iVar1;
  WebSocket *pWVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  undefined8 in_RCX;
  ushort in_DX;
  undefined4 in_register_00000034;
  WebSocketPipeImpl *adapterConstructorParams;
  undefined8 in_R8;
  PromiseAwaiter<void> *pPVar4;
  
  adapterConstructorParams = (WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd);
  handle._M_fr_ptr = operator_new(0x5f0);
  *(code **)handle._M_fr_ptr = close;
  *(code **)((long)handle._M_fr_ptr + 8) = close;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x5e0) = in_R8;
  *(WebSocketPipeImpl **)((long)handle._M_fr_ptr + 0x5d8) = adapterConstructorParams;
  location.function = "close";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xf1f;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  pWVar2 = (adapterConstructorParams->state).ptr;
  iVar1 = (int)this;
  if (pWVar2 == (WebSocket *)0x0) {
    this_02 = (kj *)((long)handle._M_fr_ptr + 0x5d0);
    *(undefined4 *)((long)handle._M_fr_ptr + 0x5a8) = 3;
    *(ushort *)((long)handle._M_fr_ptr + 0x5b0) = in_DX;
    *(undefined8 *)((long)handle._M_fr_ptr + 0x5b8) = in_RCX;
    *(undefined8 *)((long)handle._M_fr_ptr + 0x5c0) = in_R8;
    newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
              (this_02,adapterConstructorParams,
               (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                *)((long)handle._M_fr_ptr + 0x5a8));
    pPVar4 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x3f0);
    co_await<void>(pPVar4,(Promise<void> *)this_02);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 1;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
    if (bVar3) {
      return iVar1;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar4);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
  }
  else {
    this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5c8);
    (*pWVar2->_vptr_WebSocket[2])(this_01,pWVar2,(ulong)in_DX,in_RCX);
    pPVar4 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
    co_await<void>(pPVar4,(Promise<void> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
    if (bVar3) {
      return iVar1;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar4);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
  }
  *(long *)(*(long *)((long)handle._M_fr_ptr + 0x5d8) + 0x40) =
       *(long *)((long)handle._M_fr_ptr + 0x5e0) +
       *(long *)(*(long *)((long)handle._M_fr_ptr + 0x5d8) + 0x40) + 1;
  kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
            ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 2;
  return iVar1;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    KJ_IF_SOME(s, state) {
      co_await s.close(code, reason);
    } else {
      co_await newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(ClosePtr { code, reason }));
    }